

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkInsertGroup(Cba_Ntk_t *p,Vec_Int_t *vObjs,Cba_Ntk_t *pSyn)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *__ptr;
  int *piVar6;
  int x;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  pVVar5 = Cba_NtkCollectInFons(p,vObjs);
  __ptr = Cba_NtkCollectOutFons(p,vObjs);
  uVar4 = pVVar5->nSize;
  if ((pSyn->vInputs).nSize != uVar4) {
    __assert_fail("Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x45a,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  uVar1 = __ptr->nSize;
  if ((pSyn->vOutputs).nSize != uVar1) {
    __assert_fail("Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x45b,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  uVar2 = (pSyn->vFonObj).nCap;
  if ((pSyn->vFonCopy).nCap < (int)uVar2) {
    piVar6 = (pSyn->vFonCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar2 << 2);
    }
    (pSyn->vFonCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0033a7ff;
    (pSyn->vFonCopy).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((pSyn->vFonCopy).pArray,0,(ulong)uVar2 * 4);
  }
  (pSyn->vFonCopy).nSize = uVar2;
  if (0 < (pSyn->vInputs).nSize) {
    piVar6 = (pSyn->vInputs).pArray;
    uVar7 = 0;
    uVar9 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar9 = uVar7;
    }
    do {
      iVar11 = piVar6[uVar7];
      if ((long)iVar11 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((pSyn->vObjFon0).nSize <= iVar11) || (uVar9 == uVar7)) goto LAB_0033a325;
      uVar4 = (pSyn->vObjFon0).pArray[iVar11];
      if ((int)uVar4 < 1) goto LAB_0033a68f;
      if ((pSyn->vFonCopy).nSize <= (int)uVar4) goto LAB_0033a325;
      piVar3 = (pSyn->vFonCopy).pArray;
      if (piVar3[uVar4] != 0) goto LAB_0033a698;
      piVar3[uVar4] = pVVar5->pArray[uVar7];
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)(pSyn->vInputs).nSize);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
  }
  uVar4 = (pSyn->vObjType).nCap;
  if ((pSyn->vObjCopy).nCap < (int)uVar4) {
    piVar6 = (pSyn->vObjCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar4 << 2);
    }
    (pSyn->vObjCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0033a7ff;
    (pSyn->vObjCopy).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((pSyn->vObjCopy).pArray,0xff,(ulong)uVar4 * 4);
  }
  (pSyn->vObjCopy).nSize = uVar4;
  if (1 < (pSyn->vObjType).nSize) {
    lVar13 = 1;
    do {
      if ((pSyn->vObjType).nSize <= lVar13) goto LAB_0033a714;
      if (0xffffffa8 < (byte)(pSyn->vObjType).pArray[lVar13] - 0x5a) {
        uVar4 = Cba_ObjDup(p,pSyn,(int)lVar13);
        if (((pSyn->vObjFon0).nSize <= lVar13) || ((long)(pSyn->vObjFon0).nSize <= lVar13 + 1))
        goto LAB_0033a325;
        piVar6 = (pSyn->vObjFon0).pArray;
        uVar2 = piVar6[lVar13];
        uVar9 = (ulong)uVar2;
        iVar11 = 0;
        while ((int)uVar9 < piVar6[lVar13 + 1]) {
          if ((int)uVar4 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x157,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
          }
          if ((p->vObjFon0).nSize <= (int)uVar4) goto LAB_0033a325;
          if ((int)uVar2 < 1) goto LAB_0033a68f;
          if ((pSyn->vFonCopy).nSize <= (int)uVar9) goto LAB_0033a325;
          piVar3 = (pSyn->vFonCopy).pArray;
          if (piVar3[uVar9] != 0) goto LAB_0033a698;
          piVar3[uVar9] = (p->vObjFon0).pArray[uVar4] + iVar11;
          uVar9 = uVar9 + 1;
          iVar11 = iVar11 + 1;
          if ((long)(pSyn->vObjFon0).nSize <= lVar13 + 1) goto LAB_0033a325;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pSyn->vObjType).nSize);
  }
  if (1 < (pSyn->vObjType).nSize) {
    lVar13 = 1;
    do {
      if ((pSyn->vObjType).nSize <= lVar13) {
LAB_0033a714:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xffffffa8 < (byte)(pSyn->vObjType).pArray[lVar13] - 0x5a) {
        if ((pSyn->vObjCopy).nSize < 1) {
          __assert_fail("Cba_NtkHasObjCopies(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
        }
        lVar8 = lVar13 + 1;
        Vec_IntFillExtra(&pSyn->vObjCopy,(int)lVar8,-1);
        if ((((pSyn->vObjCopy).nSize <= lVar13) || ((pSyn->vObjFin0).nSize <= lVar13)) ||
           ((pSyn->vObjFin0).nSize <= lVar8)) goto LAB_0033a325;
        iVar11 = (pSyn->vObjCopy).pArray[lVar13];
        uVar4 = (pSyn->vObjFin0).pArray[lVar13];
        uVar9 = (ulong)uVar4;
        iVar12 = 0;
        while ((int)uVar9 < (pSyn->vObjFin0).pArray[lVar13 + 1]) {
          if ((int)uVar4 < 1) goto LAB_0033a6b7;
          if ((pSyn->vFinFon).nSize <= (int)uVar9) goto LAB_0033a325;
          x = (pSyn->vFinFon).pArray[uVar9];
          if (0 < (long)x) {
            if ((pSyn->vFonCopy).nSize <= x) goto LAB_0033a325;
            x = (pSyn->vFonCopy).pArray[x];
          }
          Cba_ObjSetFinFon(p,iVar11,iVar12,x);
          uVar9 = uVar9 + 1;
          iVar12 = iVar12 + 1;
          if ((pSyn->vObjFin0).nSize <= lVar8) goto LAB_0033a325;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pSyn->vObjType).nSize);
  }
  uVar4 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar4) {
    piVar6 = (p->vFonCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar4 << 2);
    }
    (p->vFonCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0033a7ff:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar4 * 4);
  }
  (p->vFonCopy).nSize = uVar4;
  if (0 < (p->vFonName).nSize) {
    Vec_IntFillExtra(&p->vFonName,(p->vFonObj).nSize,0);
  }
  if (0 < (pSyn->vOutputs).nSize) {
    pVVar5 = &p->vFonName;
    uVar7 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar7;
    }
    do {
      iVar11 = (pSyn->vOutputs).pArray[uVar7];
      if ((long)iVar11 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pSyn->vObjFin0).nSize <= iVar11) goto LAB_0033a325;
      iVar11 = (pSyn->vObjFin0).pArray[iVar11];
      if ((long)iVar11 < 1) {
LAB_0033a6b7:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pSyn->vFinFon).nSize <= iVar11) goto LAB_0033a325;
      iVar11 = (pSyn->vFinFon).pArray[iVar11];
      lVar13 = (long)iVar11;
      if (lVar13 < 1) {
LAB_0033a6f5:
        __assert_fail("Cba_FonIsReal(Cba_FonCopy(pSyn, iFon))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x476,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
      }
      if ((pSyn->vFonCopy).nSize <= iVar11) goto LAB_0033a325;
      if ((pSyn->vFonCopy).pArray[lVar13] < 1) goto LAB_0033a6f5;
      if (uVar9 == uVar7) goto LAB_0033a325;
      piVar6 = __ptr->pArray;
      uVar4 = piVar6[uVar7];
      iVar12 = iVar11;
      if (0 < iVar11) {
        if ((pSyn->vFonCopy).nSize <= iVar11) goto LAB_0033a325;
        iVar12 = (pSyn->vFonCopy).pArray[lVar13];
      }
      if ((int)uVar4 < 1) goto LAB_0033a68f;
      if ((p->vFonCopy).nSize <= (int)uVar4) goto LAB_0033a325;
      piVar3 = (p->vFonCopy).pArray;
      if (piVar3[uVar4] != 0) goto LAB_0033a698;
      piVar3[uVar4] = iVar12;
      if (0 < (p->vFonName).nSize) {
        if (0 < iVar11) {
          if ((pSyn->vFonCopy).nSize <= iVar11) goto LAB_0033a325;
          iVar11 = (pSyn->vFonCopy).pArray[lVar13];
        }
        iVar12 = piVar6[uVar7];
        if ((long)iVar12 < 1) {
          __assert_fail("Cba_FonIsReal(f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(pVVar5,iVar12 + 1,0);
        if ((p->vFonName).nSize <= iVar12) goto LAB_0033a325;
        Cba_FonSetName(p,iVar11,(p->vFonName).pArray[iVar12]);
        if ((p->vFonName).nSize < 1) {
          pcVar10 = "Cba_NtkHasFonNames(p)";
LAB_0033a7c8:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18d,"void Cba_FonCleanName(Cba_Ntk_t *, int)");
        }
        uVar4 = piVar6[uVar7];
        if ((int)uVar4 < 1) {
          pcVar10 = "Cba_FonIsReal(f)";
          goto LAB_0033a7c8;
        }
        Vec_IntFillExtra(pVVar5,uVar4 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar4) goto LAB_0033a325;
        if ((p->vFonName).pArray[uVar4] == 0) {
          pcVar10 = "Cba_FonName(p, f) != 0";
          goto LAB_0033a7c8;
        }
        Vec_IntFillExtra(pVVar5,uVar4 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar4) goto LAB_0033a771;
        (p->vFonName).pArray[uVar4] = 0;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)(pSyn->vOutputs).nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (1 < (p->vFinFon).nSize) {
    piVar6 = (p->vFinFon).pArray;
    lVar13 = 1;
    do {
      iVar11 = piVar6[lVar13];
      lVar8 = (long)iVar11;
      if (0 < lVar8) {
        if ((p->vFonCopy).nSize <= iVar11) goto LAB_0033a325;
        if ((p->vFonCopy).pArray[lVar8] != 0) {
          if ((p->vFonCopy).nSize <= iVar11) {
LAB_0033a325:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((p->vFinFon).nSize <= lVar13) {
LAB_0033a771:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (p->vFinFon).pArray[lVar13] = (p->vFonCopy).pArray[lVar8];
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (p->vFinFon).nSize);
  }
  Cba_NtkMissingFonNames(p,"j");
  return;
LAB_0033a68f:
  pcVar10 = "Cba_FonIsReal(f)";
  goto LAB_0033a69f;
LAB_0033a698:
  pcVar10 = "Cba_FonCopy(p, f) == 0";
LAB_0033a69f:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
}

Assistant:

void Cba_NtkInsertGroup( Cba_Ntk_t * p, Vec_Int_t * vObjs, Cba_Ntk_t * pSyn )
{
    Vec_Int_t * vFonIns  = Cba_NtkCollectInFons( p, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( p, vObjs );
    int k, iObj, iObjNew, iFin, iFon;
    assert( Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns) );
    assert( Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts) );
    // mark AIG with the input fons
    Cba_NtkCleanFonCopies( pSyn );
    Cba_NtkForEachPiFon( pSyn, iObj, iFon, k )
        Cba_FonSetCopy( pSyn, iFon, Vec_IntEntry(vFonIns, k) );
    Vec_IntFree( vFonIns );
    // build up internal nodes
    Cba_NtkCleanObjCopies( pSyn );
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjDup( p, pSyn, iObj );
        Cba_ObjForEachFon( pSyn, iObj, iFon, k )
            Cba_FonSetCopy( pSyn, iFon, Cba_ObjFon(p, iObjNew, k) );
    }
    // connect internal nodes
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjCopy( pSyn, iObj );
        Cba_ObjForEachFinFon( pSyn, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( p, iObjNew, k, Cba_FonCopy(pSyn, iFon) );
    }
    // connect output fons
    Cba_NtkCleanFonCopies( p );
    if ( Cba_NtkHasFonNames(p) )
        Vec_IntFillExtra( &p->vFonName, Cba_NtkFonNum(p) + 1, 0 );
    Cba_NtkForEachPoDriverFon( pSyn, iObj, iFon, k )
    {
        assert( Cba_FonIsReal(Cba_FonCopy(pSyn, iFon)) );
        Cba_FonSetCopy( p, Vec_IntEntry(vFonOuts, k), Cba_FonCopy(pSyn, iFon) );
        // transfer names
        if ( Cba_NtkHasFonNames(p) )
        {
            Cba_FonSetName( p, Cba_FonCopy(pSyn, iFon), Cba_FonName(p, Vec_IntEntry(vFonOuts, k)) );
            Cba_FonCleanName( p, Vec_IntEntry(vFonOuts, k) );
        }
    }
    Vec_IntFree( vFonOuts );
    // delete nodes
//    Vec_IntForEachEntry( vObjs, iObj, k )
//        Cba_ObjDelete( p, iObj );
    // update fins pointing to output fons to point to the new fons
    Cba_NtkForEachFinFon( p, iFon, iFin )
        if ( Cba_FonIsReal(iFon) && Cba_FonCopy(p, iFon) )
            Cba_PatchFinFon( p, iFin, Cba_FonCopy(p, iFon) );
    Cba_NtkMissingFonNames( p, "j" );
/*
    // duplicate in DFS order
    pNew = Cba_NtkDupOrder( p->pDesign, p, Cba_NtkCollectDfs );
    Cba_NtkDupAttrs( pNew, p );
    // replace "p" with "pNew"
    Cba_NtkUpdate( Cba_NtkMan(p), pNew ); // removes "p"
    return pNew;
*/
}